

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<DataStream,std::__cxx11::string,unsigned_long,int,int,int>
               (DataStream *s,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               unsigned_long *args_1,int *args_2,int *args_3,int *args_4)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,char>(s,args);
  ser_writedata64<DataStream>(s,*args_1);
  ser_writedata32<DataStream>(s,*args_2);
  ser_writedata32<DataStream>(s,*args_3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ser_writedata32<DataStream>(s,*args_4);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}